

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *this_00;
  long lVar1;
  LogMessage *other;
  Descriptor *pDVar2;
  LogFinisher local_61;
  LogMessage local_60;
  
  this_00 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  if (((~(byte)this_00[1] & 0x60) == 0) ||
     ((((pDVar2 = FieldDescriptor::message_type(this_00), pDVar2 == (Descriptor *)0x0 &&
        (((byte)this_00[1] & 2) == 0)) && (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) != '\x02'))
      && ((lVar1 = *(long *)(this_00 + 0x28), lVar1 == 0 || ((byte)this_00[1] & 0x10) == 0 ||
          ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))))))) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_string_field_lite.cc"
               ,0x1c7);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,HAZZER,false);
  variables = &(this->super_ImmutableStringFieldLiteGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldStringBytesAccessorDocComment
            (printer,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  return instance.get$capitalized_name$Bytes();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,CLEARER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldStringBytesAccessorDocComment
            (printer,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Bytes(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return instance.has$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  return instance.get$capitalized_name$();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  return instance.get$capitalized_name$Bytes();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER,
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  copyOnWrite();\n"
      "  instance.set$capitalized_name$Bytes(value);\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}